

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O0

int loader_load_from_configuration(char *path,void **handle,void *allocator)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 in_RDX;
  char *in_RDI;
  size_t join_path_size_1;
  loader_path join_path_1;
  size_t str_size_1;
  char *str_1;
  size_t join_path_size;
  size_t path_base_size;
  loader_path join_path;
  loader_path path_base;
  size_t str_size;
  char *str;
  size_t size;
  size_t iterator;
  size_t context_path_size;
  loader_path context_path_str;
  loader_path *paths;
  value *scripts_array;
  value context_path;
  value scripts;
  value tag;
  configuration config;
  loader_name config_name;
  undefined1 local_41a8 [8];
  void **in_stack_ffffffffffffbe60;
  size_t in_stack_ffffffffffffbe68;
  loader_path *in_stack_ffffffffffffbe70;
  char *in_stack_ffffffffffffbe78;
  undefined1 local_3188 [4096];
  undefined1 local_2188 [4104];
  undefined8 local_1180;
  undefined8 local_1178;
  ulong local_1170;
  ulong local_1168;
  undefined8 local_1160;
  undefined1 local_1158 [4096];
  void *local_158;
  long local_150;
  long local_148;
  long local_140;
  long local_138;
  long local_130;
  undefined1 local_128 [264];
  undefined8 local_20;
  char *local_10;
  int local_4;
  
  local_1160 = 0;
  local_20 = in_RDX;
  local_10 = in_RDI;
  iVar2 = loader_initialize();
  pcVar1 = local_10;
  if (iVar2 == 1) {
    local_4 = 1;
  }
  else {
    sVar3 = strnlen(local_10,0x1000);
    lVar4 = portability_path_get_name(pcVar1,sVar3 + 1,local_128,0xff);
    if (lVar4 == 0) {
      log_write_impl_va("metacall",0x19a,"loader_load_from_configuration",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader.c"
                        ,3,"Loader load from configuration invalid config name (%s)",local_10);
      local_4 = 1;
    }
    else {
      local_130 = configuration_create(local_128,local_10,0,local_20);
      if (local_130 == 0) {
        log_write_impl_va("metacall",0x1a3,"loader_load_from_configuration",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader.c"
                          ,3,"Loader load from configuration invalid initialization (%s)",local_10);
        local_4 = 1;
      }
      else {
        local_138 = configuration_value_type(local_130,"language_id",7);
        if (local_138 == 0) {
          log_write_impl_va("metacall",0x1ac,"loader_load_from_configuration",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader.c"
                            ,3,"Loader load from configuration invalid tag (%s)",local_10);
          configuration_clear(local_130);
          local_4 = 1;
        }
        else {
          local_140 = configuration_value_type(local_130,"scripts",9);
          if (local_140 == 0) {
            log_write_impl_va("metacall",0x1b7,"loader_load_from_configuration",
                              "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader.c"
                              ,3,"Loader load from configuration invalid scripts (%s)",local_10);
            configuration_clear(local_130);
            local_4 = 1;
          }
          else {
            local_1170 = value_type_count(local_140);
            if (local_1170 == 0) {
              log_write_impl_va("metacall",0x1c2,"loader_load_from_configuration",
                                "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader.c"
                                ,3,"Loader load from configuration cannot load zero scripts");
              configuration_clear(local_130);
              local_4 = 1;
            }
            else {
              local_158 = malloc(local_1170 << 0xc);
              if (local_158 == (void *)0x0) {
                log_write_impl_va("metacall",0x1cd,"loader_load_from_configuration",
                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader.c"
                                  ,3,"Loader load from configuration invalid paths allocation");
                configuration_clear(local_130);
                local_4 = 1;
              }
              else {
                local_148 = configuration_value_type(local_130,"path",7);
                if (local_148 != 0) {
                  local_1178 = value_to_string(local_148);
                  local_1180 = value_type_size(local_148);
                  iVar2 = portability_path_is_absolute(local_1178,local_1180);
                  if (iVar2 == 0) {
                    local_1160 = portability_path_canonical(local_1178,local_1180,local_1158,0x1000)
                    ;
                  }
                  else {
                    sVar3 = strnlen(local_10,0x1000);
                    uVar5 = portability_path_get_directory(local_10,sVar3 + 1,local_2188,0x1000);
                    uVar5 = portability_path_join
                                      (local_2188,uVar5,local_1178,local_1180,local_3188,0x1000);
                    local_1160 = portability_path_canonical(local_3188,uVar5,local_1158,0x1000);
                  }
                }
                local_150 = value_to_array(local_140);
                for (local_1168 = 0; local_1168 < local_1170; local_1168 = local_1168 + 1) {
                  if (*(long *)(local_150 + local_1168 * 8) != 0) {
                    uVar5 = value_to_string(*(undefined8 *)(local_150 + local_1168 * 8));
                    uVar6 = value_type_size(*(undefined8 *)(local_150 + local_1168 * 8));
                    if (local_148 == 0) {
                      portability_path_canonical
                                (uVar5,uVar6,(void *)((long)local_158 + local_1168 * 0x1000),0x1000)
                      ;
                    }
                    else {
                      uVar5 = portability_path_join
                                        (local_1158,local_1160,uVar5,uVar6,local_41a8,0x1000);
                      portability_path_canonical
                                (local_41a8,uVar5,(void *)((long)local_158 + local_1168 * 0x1000),
                                 0x1000);
                    }
                  }
                }
                value_to_string(local_138);
                iVar2 = loader_load_from_file
                                  (in_stack_ffffffffffffbe78,in_stack_ffffffffffffbe70,
                                   in_stack_ffffffffffffbe68,in_stack_ffffffffffffbe60);
                if (iVar2 == 0) {
                  configuration_clear(local_130);
                  free(local_158);
                  local_4 = 0;
                }
                else {
                  log_write_impl_va("metacall",0x207,"loader_load_from_configuration",
                                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader.c"
                                    ,3,"Loader load from configuration invalid load from file");
                  configuration_clear(local_130);
                  free(local_158);
                  local_4 = 1;
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int loader_load_from_configuration(const loader_path path, void **handle, void *allocator)
{
	loader_name config_name;
	configuration config;
	value tag, scripts, context_path;
	value *scripts_array;
	loader_path *paths;
	loader_path context_path_str;
	size_t context_path_size = 0;
	size_t iterator, size;

	if (loader_initialize() == 1)
	{
		return 1;
	}

	if (portability_path_get_name(path, strnlen(path, LOADER_PATH_SIZE) + 1, config_name, LOADER_NAME_SIZE) == 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader load from configuration invalid config name (%s)", path);

		return 1;
	}

	config = configuration_create(config_name, path, NULL, allocator);

	if (config == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader load from configuration invalid initialization (%s)", path);

		return 1;
	}

	tag = configuration_value_type(config, "language_id", TYPE_STRING);

	if (tag == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader load from configuration invalid tag (%s)", path);

		configuration_clear(config);

		return 1;
	}

	scripts = configuration_value_type(config, "scripts", TYPE_ARRAY);

	if (scripts == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader load from configuration invalid scripts (%s)", path);

		configuration_clear(config);

		return 1;
	}

	size = value_type_count(scripts);

	if (size == 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader load from configuration cannot load zero scripts");

		configuration_clear(config);

		return 1;
	}

	paths = malloc(sizeof(loader_path) * size);

	if (paths == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader load from configuration invalid paths allocation");

		configuration_clear(config);

		return 1;
	}

	context_path = configuration_value_type(config, "path", TYPE_STRING);

	if (context_path != NULL)
	{
		const char *str = value_to_string(context_path);

		size_t str_size = value_type_size(context_path);

		if (portability_path_is_absolute(str, str_size) == 0)
		{
			context_path_size = portability_path_canonical(str, str_size, context_path_str, LOADER_PATH_SIZE);
		}
		else
		{
			loader_path path_base, join_path;

			size_t path_base_size = portability_path_get_directory(path, strnlen(path, LOADER_PATH_SIZE) + 1, path_base, LOADER_PATH_SIZE);

			size_t join_path_size = portability_path_join(path_base, path_base_size, str, str_size, join_path, LOADER_PATH_SIZE);

			context_path_size = portability_path_canonical(join_path, join_path_size, context_path_str, LOADER_PATH_SIZE);
		}
	}

	scripts_array = value_to_array(scripts);

	for (iterator = 0; iterator < size; ++iterator)
	{
		if (scripts_array[iterator] != NULL)
		{
			const char *str = value_to_string(scripts_array[iterator]);

			size_t str_size = value_type_size(scripts_array[iterator]);

			if (context_path == NULL)
			{
				(void)portability_path_canonical(str, str_size, paths[iterator], LOADER_PATH_SIZE);
			}
			else
			{
				loader_path join_path;

				size_t join_path_size = portability_path_join(context_path_str, context_path_size, str, str_size, join_path, LOADER_PATH_SIZE);

				(void)portability_path_canonical(join_path, join_path_size, paths[iterator], LOADER_PATH_SIZE);
			}
		}
	}

	if (loader_load_from_file((const char *)value_to_string(tag), (const loader_path *)paths, size, handle) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader load from configuration invalid load from file");

		configuration_clear(config);

		free(paths);

		return 1;
	}

	configuration_clear(config);

	free(paths);

	return 0;
}